

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::AddInstruction(SQFuncState *this,SQInstruction *i)

{
  bool bVar1;
  SQUnsignedInteger SVar2;
  SQInstruction *pSVar3;
  SQFuncState *this_00;
  SQInstruction *in_RSI;
  long *in_RDI;
  SQInteger aat;
  SQInstruction *pi;
  SQInteger size;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  sqvector<SQInstruction> *in_stack_ffffffffffffffc0;
  long local_28;
  
  SVar2 = sqvector<SQInstruction>::size((sqvector<SQInstruction> *)(in_RDI + 0x18));
  if ((0 < (long)SVar2) && ((*(byte *)(in_RDI + 0x3a) & 1) != 0)) {
    pSVar3 = sqvector<SQInstruction>::operator[]
                       ((sqvector<SQInstruction> *)(in_RDI + 0x18),SVar2 - 1);
    this_00 = (SQFuncState *)(ulong)in_RSI->op;
    switch(this_00) {
    case (SQFuncState *)0x0:
      if (pSVar3->op == '\0') {
        sqvector<SQInstruction>::pop_back((sqvector<SQInstruction> *)(in_RDI + 0x18));
        sqvector<SQLineInfo>::pop_back((sqvector<SQLineInfo> *)(in_RDI + 0x27));
      }
      break;
    case (SQFuncState *)0x1:
      if ((pSVar3->op == '\x01') && (in_RSI->_arg1 < 0x100)) {
        pSVar3->op = '\x04';
        pSVar3->_arg2 = in_RSI->_arg0;
        pSVar3->_arg3 = (uchar)in_RSI->_arg1;
        return;
      }
      break;
    case (SQFuncState *)0x7:
      if (((pSVar3->op == '\x01') && ((uint)pSVar3->_arg0 == in_RSI->_arg1)) &&
         (bVar1 = IsLocal(this_00,(SQUnsignedInteger)in_stack_ffffffffffffffc0), !bVar1)) {
        pSVar3->op = '\b';
        pSVar3->_arg0 = in_RSI->_arg0;
        pSVar3->_arg1 = pSVar3->_arg1;
        pSVar3->_arg2 = in_RSI->_arg2;
        pSVar3->_arg3 = in_RSI->_arg3;
        return;
      }
      break;
    case (SQFuncState *)0xa:
      in_stack_ffffffffffffffbc = (uint)pSVar3->op;
      if (((((in_stack_ffffffffffffffbc - 1 < 3) || (in_stack_ffffffffffffffbc == 0xe)) ||
           (in_stack_ffffffffffffffbc - 0x11 < 6)) || (in_stack_ffffffffffffffbc == 0x1a)) &&
         ((uint)pSVar3->_arg0 == in_RSI->_arg1)) {
        pSVar3->_arg0 = in_RSI->_arg0;
        *(undefined1 *)(in_RDI + 0x3a) = 0;
        return;
      }
      if (pSVar3->op == '\n') {
        pSVar3->op = '\x1b';
        pSVar3->_arg2 = in_RSI->_arg0;
        pSVar3->_arg3 = (uchar)in_RSI->_arg1;
        return;
      }
      break;
    case (SQFuncState *)0xb:
    case (SQFuncState *)0xd:
      if (in_RSI->_arg0 == in_RSI->_arg3) {
        in_RSI->_arg0 = 0xff;
      }
      break;
    case (SQFuncState *)0xe:
      if (((pSVar3->op == '\x01') && (pSVar3->_arg0 == in_RSI->_arg2)) &&
         (bVar1 = IsLocal(this_00,(SQUnsignedInteger)in_stack_ffffffffffffffc0), !bVar1)) {
        pSVar3->_arg1 = pSVar3->_arg1;
        pSVar3->_arg2 = (uchar)in_RSI->_arg1;
        pSVar3->op = '\t';
        pSVar3->_arg0 = in_RSI->_arg0;
        return;
      }
      break;
    case (SQFuncState *)0xf:
    case (SQFuncState *)0x10:
      if (((pSVar3->op == '\x01') && ((uint)pSVar3->_arg0 == in_RSI->_arg1)) &&
         (bVar1 = IsLocal(this_00,(SQUnsignedInteger)in_stack_ffffffffffffffc0), !bVar1)) {
        pSVar3->op = in_RSI->op;
        pSVar3->_arg0 = in_RSI->_arg0;
        pSVar3->_arg1 = pSVar3->_arg1;
        pSVar3->_arg2 = in_RSI->_arg2;
        pSVar3->_arg3 = 0xff;
        return;
      }
      break;
    case (SQFuncState *)0x17:
      if ((((in_RDI[0x2a] == 0) || (in_RSI->_arg0 == 0xff)) || (pSVar3->op != '\x06')) ||
         ((long)(SVar2 - 1) <= *in_RDI)) {
        if (pSVar3->op == '<') {
          *pSVar3 = *in_RSI;
          return;
        }
      }
      else {
        pSVar3->op = '\x05';
      }
      break;
    case (SQFuncState *)0x18:
      if ((pSVar3->op == '\x18') && ((uint)pSVar3->_arg0 + pSVar3->_arg1 == (uint)in_RSI->_arg0)) {
        pSVar3->_arg1 = pSVar3->_arg1 + 1;
        pSVar3->op = '\x18';
        return;
      }
      break;
    case (SQFuncState *)0x1e:
      if ((pSVar3->op == '(') && (pSVar3->_arg1 < 0xff)) {
        pSVar3->op = '\x1d';
        pSVar3->_arg0 = (uchar)pSVar3->_arg1;
        pSVar3->_arg1 = in_RSI->_arg1;
        return;
      }
      break;
    case (SQFuncState *)0x1f:
      if (in_RSI->_arg0 == in_RSI->_arg2) {
        in_RSI->_arg0 = 0xff;
      }
      break;
    case (SQFuncState *)0x22:
      local_28 = -1;
      in_stack_ffffffffffffffc0 = (sqvector<SQInstruction> *)(ulong)(pSVar3->op - 1);
      switch(in_stack_ffffffffffffffc0) {
      case (sqvector<SQInstruction> *)0x0:
        local_28 = 1;
        break;
      case (sqvector<SQInstruction> *)0x1:
        local_28 = 2;
        break;
      case (sqvector<SQInstruction> *)0x2:
        local_28 = 3;
        break;
      default:
        break;
      case (sqvector<SQInstruction> *)0x19:
        local_28 = 4;
      }
      if (((local_28 != -1) && ((uint)pSVar3->_arg0 == in_RSI->_arg1)) &&
         (bVar1 = IsLocal(this_00,(SQUnsignedInteger)in_stack_ffffffffffffffc0), !bVar1)) {
        pSVar3->op = '\"';
        pSVar3->_arg0 = in_RSI->_arg0;
        pSVar3->_arg1 = pSVar3->_arg1;
        pSVar3->_arg2 = (uchar)local_28;
        pSVar3->_arg3 = 0xff;
        return;
      }
    }
  }
  *(undefined1 *)(in_RDI + 0x3a) = 1;
  sqvector<SQInstruction>::push_back
            (in_stack_ffffffffffffffc0,
             (SQInstruction *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

void SQFuncState::AddInstruction(SQInstruction &i)
{
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){ //simple optimizer
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(i.op) {
        case _OP_JZ:
            if( pi.op == _OP_CMP && pi._arg1 < 0xFF) {
                pi.op = _OP_JCMP;
                pi._arg0 = (unsigned char)pi._arg1;
                pi._arg1 = i._arg1;
                return;
            }
            break;
        case _OP_SET:
        case _OP_NEWSLOT:
            if(i._arg0 == i._arg3) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_SETOUTER:
            if(i._arg0 == i._arg2) {
                i._arg0 = 0xFF;
            }
            break;
        case _OP_RETURN:
            if( _parent && i._arg0 != MAX_FUNC_STACKSIZE && pi.op == _OP_CALL && _returnexp < size-1) {
                pi.op = _OP_TAILCALL;
            } else if(pi.op == _OP_CLOSE){
                pi = i;
                return;
            }
        break;
        case _OP_GET:
            if( pi.op == _OP_LOAD && pi._arg0 == i._arg2 && (!IsLocal(pi._arg0))){
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)i._arg1;
                pi.op = _OP_GETK;
                pi._arg0 = i._arg0;

                return;
            }
        break;
        case _OP_PREPCALL:
            if( pi.op == _OP_LOAD  && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_PREPCALLK;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = i._arg3;
                return;
            }
            break;
        case _OP_APPENDARRAY: {
            SQInteger aat = -1;
            switch(pi.op) {
            case _OP_LOAD: aat = AAT_LITERAL; break;
            case _OP_LOADINT: aat = AAT_INT; break;
            case _OP_LOADBOOL: aat = AAT_BOOL; break;
            case _OP_LOADFLOAT: aat = AAT_FLOAT; break;
            default: break;
            }
            if(aat != -1 && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0))){
                pi.op = _OP_APPENDARRAY;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = (unsigned char)aat;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
                              }
            break;
        case _OP_MOVE:
            switch(pi.op) {
            case _OP_GET: case _OP_ADD: case _OP_SUB: case _OP_MUL: case _OP_DIV: case _OP_MOD: case _OP_BITW:
            case _OP_LOADINT: case _OP_LOADFLOAT: case _OP_LOADBOOL: case _OP_LOAD:

                if(pi._arg0 == i._arg1)
                {
                    pi._arg0 = i._arg0;
                    _optimization = false;
                    //_result_elimination = false;
                    return;
                }
            }

            if(pi.op == _OP_MOVE)
            {
                pi.op = _OP_DMOVE;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_LOAD:
            if(pi.op == _OP_LOAD && i._arg1 < 256) {
                pi.op = _OP_DLOAD;
                pi._arg2 = i._arg0;
                pi._arg3 = (unsigned char)i._arg1;
                return;
            }
            break;
        case _OP_EQ:case _OP_NE:
            if(pi.op == _OP_LOAD && pi._arg0 == i._arg1 && (!IsLocal(pi._arg0) ))
            {
                pi.op = i.op;
                pi._arg0 = i._arg0;
                pi._arg1 = pi._arg1;
                pi._arg2 = i._arg2;
                pi._arg3 = MAX_FUNC_STACKSIZE;
                return;
            }
            break;
        case _OP_LOADNULLS:
            if((pi.op == _OP_LOADNULLS && pi._arg0+pi._arg1 == i._arg0)) {

                pi._arg1 = pi._arg1 + 1;
                pi.op = _OP_LOADNULLS;
                return;
            }
            break;
        case _OP_LINE:
            if(pi.op == _OP_LINE) {
                _instructions.pop_back();
                _lineinfos.pop_back();
            }
            break;
        }
    }
    _optimization = true;
    _instructions.push_back(i);
}